

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O3

int __thiscall Sudoku::doplnM(Sudoku *this,int x,int y,int cislo)

{
  uint *puVar1;
  uint uVar2;
  uint *puVar3;
  uint uVar4;
  byte bVar5;
  
  if ((uint)y < 9 && (uint)x < 9) {
    uVar2 = y * 9 + x;
    bVar5 = *(byte *)((this->s).pole + uVar2);
    if ((bVar5 & 0x10) == 0) {
      puVar3 = (this->s).ctverce[(x & 0xffU) / 3] + (y & 0xffU) / 3;
      uVar4 = 1 << ((byte)cislo & 0x1f);
      if ((((this->s).sloupce[(uint)x] | (this->s).radky[(uint)y] | *puVar3) >> (cislo & 0x1fU) & 1)
          != 0) {
        (this->s).rozbite = 1;
        bVar5 = *(byte *)((this->s).pole + uVar2);
      }
      *(byte *)((this->s).pole + uVar2) = bVar5 & 0xf0 | (byte)cislo & 0xf;
      puVar1 = (this->s).radky + (uint)y;
      *puVar1 = *puVar1 | uVar4;
      puVar1 = (this->s).sloupce + (uint)x;
      *puVar1 = *puVar1 | uVar4;
      *puVar3 = *puVar3 | uVar4;
      puVar3 = &(this->s).doplnenych;
      *puVar3 = *puVar3 + 1;
    }
  }
  return 0;
}

Assistant:

int Sudoku::doplnM (int x, int y, int cislo)
{
  // jsme v mezich hraciho pole?
  if(0 <= x && x < 9)
    if(0 <= y && y < 9)
    {
      if(s.pole[y*9+x].pevne)// neprepisujeme pevna cisla
        return false;
      unsigned int zakazano = s.radky[y] | s.sloupce[x] | s.ctverce[x/3][y/3]; // prusecik mnozin zakazanych hodnot
      if(!((1 << cislo) & ~zakazano)) // je zakazano doplnit cislo na policko?
      {
        s.rozbite = true; // doplnujeme manualne, tudiz toto vede k doplneni a neplatnosti hraci plochy
      }
      s.pole[y*9+x].zapsane = cislo;// zapiseme cislo na uvedenou pozici
      // zakazeme pouzit cislo v radku, sloupci a ctverci
      s.radky[y] |= (1 << cislo);
      s.sloupce[x] |= (1 << cislo);
      s.ctverce[x/3][y/3] |= (1 << cislo);
      s.doplnenych++;
    }
  return false;
}